

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_asn1.cc
# Opt level: O0

DSA * DSA_parse_private_key(CBS *cbs)

{
  bool bVar1;
  int iVar2;
  DSA *__p;
  pointer pdVar3;
  size_t sVar4;
  uint64_t local_40;
  uint64_t version;
  CBS child;
  unique_ptr<dsa_st,_bssl::internal::Deleter> local_20;
  UniquePtr<DSA> ret;
  CBS *cbs_local;
  
  ret._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_dsa_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<dsa_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_data<dsa_st,_bssl::internal::Deleter,_true,_true>)cbs;
  __p = DSA_new();
  std::unique_ptr<dsa_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<dsa_st,bssl::internal::Deleter> *)&local_20,(pointer)__p);
  bVar1 = std::operator==(&local_20,(nullptr_t)0x0);
  if (bVar1) {
    cbs_local = (CBS *)0x0;
  }
  else {
    iVar2 = CBS_get_asn1((CBS *)ret._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t
                                .super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl,(CBS *)&version,
                         0x20000010);
    if (iVar2 != 0) {
      iVar2 = CBS_get_asn1_uint64((CBS *)&version,&local_40);
      if (iVar2 != 0) {
        if (local_40 == 0) {
          pdVar3 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::operator->(&local_20);
          iVar2 = parse_integer((CBS *)&version,&pdVar3->p);
          if (iVar2 != 0) {
            pdVar3 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::operator->(&local_20);
            iVar2 = parse_integer((CBS *)&version,&pdVar3->q);
            if (iVar2 != 0) {
              pdVar3 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::operator->(&local_20);
              iVar2 = parse_integer((CBS *)&version,&pdVar3->g);
              if (iVar2 != 0) {
                pdVar3 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::operator->(&local_20);
                iVar2 = parse_integer((CBS *)&version,&pdVar3->pub_key);
                if (iVar2 != 0) {
                  pdVar3 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::operator->(&local_20);
                  iVar2 = parse_integer((CBS *)&version,&pdVar3->priv_key);
                  if (iVar2 != 0) {
                    sVar4 = CBS_len((CBS *)&version);
                    if (sVar4 == 0) {
                      pdVar3 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::get(&local_20);
                      iVar2 = dsa_check_key(pdVar3);
                      if (iVar2 == 0) {
                        cbs_local = (CBS *)0x0;
                      }
                      else {
                        cbs_local = (CBS *)std::unique_ptr<dsa_st,_bssl::internal::Deleter>::release
                                                     (&local_20);
                      }
                      goto LAB_002d6dd7;
                    }
                  }
                }
              }
            }
          }
          ERR_put_error(10,0,0x69,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_asn1.cc"
                        ,0xe7);
          cbs_local = (CBS *)0x0;
        }
        else {
          ERR_put_error(10,0,0x68,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_asn1.cc"
                        ,0xdd);
          cbs_local = (CBS *)0x0;
        }
        goto LAB_002d6dd7;
      }
    }
    ERR_put_error(10,0,0x69,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_asn1.cc"
                  ,0xd8);
    cbs_local = (CBS *)0x0;
  }
LAB_002d6dd7:
  child.len._4_4_ = 1;
  std::unique_ptr<dsa_st,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  return (DSA *)cbs_local;
}

Assistant:

DSA *DSA_parse_private_key(CBS *cbs) {
  bssl::UniquePtr<DSA> ret(DSA_new());
  if (ret == nullptr) {
    return nullptr;
  }

  CBS child;
  uint64_t version;
  if (!CBS_get_asn1(cbs, &child, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1_uint64(&child, &version)) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_DECODE_ERROR);
    return nullptr;
  }

  if (version != 0) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_BAD_VERSION);
    return nullptr;
  }

  if (!parse_integer(&child, &ret->p) ||
      !parse_integer(&child, &ret->q) ||
      !parse_integer(&child, &ret->g) ||
      !parse_integer(&child, &ret->pub_key) ||
      !parse_integer(&child, &ret->priv_key) ||
      CBS_len(&child) != 0) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_DECODE_ERROR);
    return nullptr;
  }
  if (!dsa_check_key(ret.get())) {
    return nullptr;
  }

  return ret.release();
}